

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

void __thiscall
pbrt::CurveCommon::CurveCommon
          (CurveCommon *this,span<const_pbrt::Point3<float>_> c,Float width0,Float width1,
          CurveType type,span<const_pbrt::Normal3<float>_> norm,Transform *renderFromObject,
          Transform *objectFromRender,bool reverseOrientation)

{
  undefined8 uVar1;
  float fVar2;
  Normal3<float> n;
  Normal3<float> b;
  Normal3<float> a;
  bool bVar3;
  size_t sVar4;
  Point3<float> *pPVar5;
  Normal3<float> *pNVar6;
  undefined4 in_ECX;
  char (*pacVar7) [2];
  char (*in_RDI) [2];
  long *in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  Float FVar8;
  double dVar9;
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  undefined4 in_XMM1_Da;
  Normal3<float> NVar14;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  byte in_stack_00000018;
  int i;
  int vb;
  size_t va;
  char (*local_138) [2];
  char (*args) [9];
  char (*fmt) [2];
  undefined8 in_stack_fffffffffffffef0;
  int line;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  LogLevel level;
  char (*in_stack_ffffffffffffff10) [9];
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  char (*in_stack_ffffffffffffff20) [2];
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Transform *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff7c;
  float fVar15;
  undefined4 in_stack_ffffffffffffff9c;
  float fVar16;
  int local_50;
  span<const_pbrt::Normal3<float>_> local_28;
  span<const_pbrt::Point3<float>_> local_18;
  undefined1 auVar10 [64];
  float fVar13;
  
  *(undefined4 *)in_RDI = in_ECX;
  fmt = in_RDI + 2;
  args = (char (*) [9])(in_RDI + 0x1a);
  do {
    Point3<float>::Point3((Point3<float> *)0x460143);
    fmt = (char (*) [2])(fmt[4] + 1 + 3);
  } while ((char (*) [9])fmt != args);
  local_138 = in_RDI + 0x1e;
  pacVar7 = in_RDI + 0x2a;
  do {
    Normal3<float>::Normal3((Normal3<float> *)0x460184);
    level = (LogLevel)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    line = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    local_138 = local_138 + 6;
  } while (local_138 != pacVar7);
  *(undefined8 *)(in_RDI + 0x30) = in_stack_00000008;
  *(undefined8 *)(in_RDI + 0x34) = in_stack_00000010;
  in_RDI[0x38][0] = in_stack_00000018 & 1;
  bVar3 = Transform::SwapsHandedness(in_stack_ffffffffffffff70);
  in_RDI[0x38][1] = bVar3;
  *(undefined4 *)(in_RDI + 0x1a) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0x1c) = in_XMM1_Da;
  sVar4 = pstd::span<const_pbrt::Point3<float>_>::size(&local_18);
  if (sVar4 != 4) {
    LogFatal<char_const(&)[9],char_const(&)[2],char_const(&)[9],unsigned_long&,char_const(&)[2],int&>
              (level,(char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),line,*fmt
               ,args,in_RDI,in_stack_ffffffffffffff10,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff20,
               (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
    pPVar5 = pstd::span<const_pbrt::Point3<float>_>::operator[](&local_18,(long)local_50);
    *(undefined8 *)(in_RDI + (long)local_50 * 6 + 2) =
         *(undefined8 *)&pPVar5->super_Tuple3<pbrt::Point3,_float>;
    *(float *)(in_RDI + (long)local_50 * 6 + 2 + 4) = (pPVar5->super_Tuple3<pbrt::Point3,_float>).z;
  }
  sVar4 = pstd::span<const_pbrt::Normal3<float>_>::size(&local_28);
  if (sVar4 == 2) {
    pNVar6 = pstd::span<const_pbrt::Normal3<float>_>::operator[](&local_28,0);
    fVar15 = (pNVar6->super_Tuple3<pbrt::Normal3,_float>).z;
    fVar2 = (pNVar6->super_Tuple3<pbrt::Normal3,_float>).x;
    auVar12 = ZEXT856(0);
    NVar14.super_Tuple3<pbrt::Normal3,_float>.z = SUB84(args,0);
    NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_ = in_RDI;
    NVar14 = Normalize<float>(NVar14);
    fVar13 = NVar14.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar10._0_8_ = NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar10._8_56_ = auVar12;
    uVar1 = vmovlpd_avx(auVar10._0_16_);
    fVar16 = (float)uVar1;
    *(float *)(in_RDI + 0x22) = fVar13;
    *(undefined8 *)(in_RDI + 0x1e) = uVar1;
    pstd::span<const_pbrt::Normal3<float>_>::operator[](&local_28,1);
    auVar12 = ZEXT856(0);
    n.super_Tuple3<pbrt::Normal3,_float>.z = SUB84(args,0);
    n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = in_RDI;
    NVar14 = Normalize<float>(n);
    auVar11._0_8_ = NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar11._8_56_ = auVar12;
    uVar1 = vmovlpd_avx(auVar11._0_16_);
    *(float *)(in_RDI + 0x28) = NVar14.super_Tuple3<pbrt::Normal3,_float>.z;
    *(undefined8 *)(in_RDI + 0x24) = uVar1;
    a.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_ffffffffffffff9c;
    a.super_Tuple3<pbrt::Normal3,_float>.x = fVar15;
    a.super_Tuple3<pbrt::Normal3,_float>.z = fVar16;
    b.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_ffffffffffffff7c;
    b.super_Tuple3<pbrt::Normal3,_float>.x = fVar13;
    b.super_Tuple3<pbrt::Normal3,_float>.z = fVar2;
    FVar8 = AngleBetween<float>(a,b);
    *(Float *)(in_RDI + 0x2a) = FVar8;
    dVar9 = std::sin((double)(ulong)*(uint *)(in_RDI + 0x2a));
    *(float *)(in_RDI + 0x2c) = 1.0 / SUB84(dVar9,0);
  }
  *(long *)(*in_FS_OFFSET + -0x4a8) = *(long *)(*in_FS_OFFSET + -0x4a8) + 1;
  return;
}

Assistant:

CurveCommon::CurveCommon(pstd::span<const Point3f> c, Float width0, Float width1,
                         CurveType type, pstd::span<const Normal3f> norm,
                         const Transform *renderFromObject,
                         const Transform *objectFromRender, bool reverseOrientation)
    : type(type),
      renderFromObject(renderFromObject),
      objectFromRender(objectFromRender),
      reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject->SwapsHandedness()) {
    width[0] = width0;
    width[1] = width1;
    CHECK_EQ(c.size(), 4);
    for (int i = 0; i < 4; ++i)
        cpObj[i] = c[i];
    if (norm.size() == 2) {
        n[0] = Normalize(norm[0]);
        n[1] = Normalize(norm[1]);
        normalAngle = AngleBetween(n[0], n[1]);
        invSinNormalAngle = 1 / std::sin(normalAngle);
    }
    ++nCurves;
}